

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server_req_handlers.cxx
# Opt level: O0

ptr<resp_msg> __thiscall
cornerstone::raft_server::handle_install_snapshot_req(raft_server *this,req_msg *req)

{
  bool bVar1;
  log_val_type lVar2;
  ulong uVar3;
  element_type *peVar4;
  ulong uVar5;
  element_type *peVar6;
  element_type *peVar7;
  size_type sVar8;
  element_type *this_00;
  snapshot *psVar9;
  char *__s;
  allocator<char> *__a;
  element_type *this_01;
  element_type *this_02;
  buffer *pbVar10;
  size_t sVar11;
  req_msg *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  sockaddr *__addr;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  socklen_t *in_RSI;
  element_type *in_RDI;
  ptr<resp_msg> pVar13;
  ptr<snapshot_sync_req> sync_req;
  vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
  *entries;
  ptr<resp_msg> *resp;
  undefined4 in_stack_fffffffffffffcd8;
  int in_stack_fffffffffffffcdc;
  strfmt<200> *in_stack_fffffffffffffce0;
  int *in_stack_fffffffffffffce8;
  log_entry *in_stack_fffffffffffffcf0;
  int iVar14;
  unsigned_long *in_stack_fffffffffffffcf8;
  undefined7 in_stack_fffffffffffffd00;
  undefined1 in_stack_fffffffffffffd07;
  raft_server *in_stack_fffffffffffffd10;
  char *in_stack_fffffffffffffd18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd20;
  allocator<char> local_229;
  strfmt<100> local_228;
  string local_1b8 [55];
  allocator<char> local_181;
  string local_180 [32];
  vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
  *local_160;
  undefined4 local_158;
  allocator<char> local_151;
  string local_150 [32];
  int32 local_130;
  undefined4 local_12c;
  ulong local_128;
  byte local_11d;
  allocator<char> local_109 [137];
  snapshot_sync_req *in_stack_ffffffffffffff80;
  raft_server *in_stack_ffffffffffffff88;
  string local_38 [32];
  req_msg *local_18;
  
  local_18 = in_RDX;
  uVar3 = msg_base::get_term(&in_RDX->super_msg_base);
  peVar4 = std::
           __shared_ptr_access<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1d87db);
  uVar5 = srv_state::get_term(peVar4);
  if ((uVar3 == uVar5) && ((*(byte *)((long)in_RSI + 0x2a) & 1) == 0)) {
    if (in_RSI[0x4a] == 2) {
      become_follower(in_stack_fffffffffffffd10);
    }
    else {
      if (in_RSI[0x4a] == 3) {
        peVar7 = std::
                 __shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1d8855);
        strfmt<200>::strfmt((strfmt<200> *)(local_109 + 1),
                            "Receive InstallSnapshotRequest from another leader(%d) with same term, there must be a bug, server exits"
                           );
        msg_base::get_src(&local_18->super_msg_base);
        strfmt<200>::fmt<int>(in_stack_fffffffffffffce0,in_stack_fffffffffffffcdc);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
                   (allocator<char> *)in_stack_fffffffffffffd10);
        (*peVar7->_vptr_logger[5])(peVar7,local_38);
        std::__cxx11::string::~string(local_38);
        std::allocator<char>::~allocator(local_109);
        std::unique_ptr<cornerstone::context,_std::default_delete<cornerstone::context>_>::
        operator->((unique_ptr<cornerstone::context,_std::default_delete<cornerstone::context>_> *)
                   0x1d8917);
        peVar6 = std::
                 __shared_ptr_access<cornerstone::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<cornerstone::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1d891f);
        (*peVar6->_vptr_state_mgr[8])(peVar6,0xffffffff);
        exit(-1);
      }
      restart_election_timer
                ((raft_server *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00));
    }
  }
  local_11d = 0;
  peVar4 = std::
           __shared_ptr_access<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1d89ad);
  local_128 = srv_state::get_term(peVar4);
  local_12c = 0x11;
  pbVar10 = (buffer *)(in_RSI + 3);
  local_130 = msg_base::get_src(&local_18->super_msg_base);
  cs_new<cornerstone::resp_msg,unsigned_long,cornerstone::msg_type,int&,int>
            (in_stack_fffffffffffffcf8,(msg_type *)in_stack_fffffffffffffcf0,
             in_stack_fffffffffffffce8,(int *)in_stack_fffffffffffffce0);
  if ((*(byte *)((long)in_RSI + 0x2a) & 1) == 0) {
    uVar3 = msg_base::get_term(&local_18->super_msg_base);
    peVar4 = std::
             __shared_ptr_access<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1d8a5d);
    uVar5 = srv_state::get_term(peVar4);
    if (uVar3 < uVar5) {
      peVar7 = std::
               __shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1d8a9c);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
                 (allocator<char> *)in_stack_fffffffffffffd10);
      (*peVar7->_vptr_logger[3])(peVar7,local_150);
      std::__cxx11::string::~string(local_150);
      std::allocator<char>::~allocator(&local_151);
      local_11d = 1;
      local_158 = 1;
      _Var12._M_pi = extraout_RDX;
      goto LAB_001d8f73;
    }
  }
  local_160 = req_msg::log_entries(local_18);
  sVar8 = std::
          vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
          ::size(local_160);
  if (sVar8 == 1) {
    std::
    vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
    ::operator[](local_160,0);
    this_00 = std::
              __shared_ptr_access<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1d8bd9);
    lVar2 = log_entry::get_val_type(this_00);
    if (lVar2 == snp_sync_req) {
      std::
      vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
      ::operator[](local_160,0);
      std::__shared_ptr_access<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1d8cec);
      log_entry::get_buf(in_stack_fffffffffffffcf0);
      snapshot_sync_req::deserialize(pbVar10);
      std::
      __shared_ptr_access<cornerstone::snapshot_sync_req,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<cornerstone::snapshot_sync_req,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1d8d1c);
      psVar9 = snapshot_sync_req::get_snapshot((snapshot_sync_req *)0x1d8d24);
      uVar3 = snapshot::get_last_log_idx(psVar9);
      if (*(ulong *)(in_RSI + 8) < uVar3) {
        std::
        __shared_ptr_access<cornerstone::snapshot_sync_req,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator*((__shared_ptr_access<cornerstone::snapshot_sync_req,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)in_stack_fffffffffffffce0);
        bVar1 = handle_snapshot_sync_req(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
        if (bVar1) {
          this_01 = std::
                    __shared_ptr_access<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x1d8ed9);
          this_02 = std::
                    __shared_ptr_access<cornerstone::snapshot_sync_req,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<cornerstone::snapshot_sync_req,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x1d8eeb);
          uVar3 = snapshot_sync_req::get_offset(this_02);
          iVar14 = (int)uVar3;
          std::
          __shared_ptr_access<cornerstone::snapshot_sync_req,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<cornerstone::snapshot_sync_req,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1d8f07);
          pbVar10 = snapshot_sync_req::get_data((snapshot_sync_req *)0x1d8f0f);
          sVar11 = buffer::size(pbVar10);
          resp_msg::accept(this_01,iVar14 + (int)sVar11,__addr,in_RSI);
        }
      }
      else {
        peVar7 = std::
                 __shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1d8d67);
        strfmt<100>::strfmt(&local_228,
                            "received a snapshot (%llu) that is older than current log store");
        std::
        __shared_ptr_access<cornerstone::snapshot_sync_req,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<cornerstone::snapshot_sync_req,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1d8d8f);
        psVar9 = snapshot_sync_req::get_snapshot((snapshot_sync_req *)0x1d8d97);
        __s = (char *)snapshot::get_last_log_idx(psVar9);
        __a = (allocator<char> *)
              strfmt<100>::fmt<unsigned_long>
                        ((strfmt<100> *)in_stack_fffffffffffffce0,
                         CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar9,__s,
                   __a);
        (*peVar7->_vptr_logger[4])(peVar7,local_1b8);
        std::__cxx11::string::~string(local_1b8);
        std::allocator<char>::~allocator(&local_229);
      }
      local_11d = 1;
      local_158 = 1;
      std::shared_ptr<cornerstone::snapshot_sync_req>::~shared_ptr
                ((shared_ptr<cornerstone::snapshot_sync_req> *)0x1d8f62);
      _Var12._M_pi = extraout_RDX_01;
      goto LAB_001d8f73;
    }
  }
  peVar7 = std::__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1d8c0e);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
             (allocator<char> *)in_stack_fffffffffffffd10);
  (*peVar7->_vptr_logger[4])(peVar7,local_180);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator(&local_181);
  local_11d = 1;
  local_158 = 1;
  _Var12._M_pi = extraout_RDX_00;
LAB_001d8f73:
  if ((local_11d & 1) == 0) {
    std::shared_ptr<cornerstone::resp_msg>::~shared_ptr
              ((shared_ptr<cornerstone::resp_msg> *)0x1d8f8a);
    _Var12._M_pi = extraout_RDX_02;
  }
  pVar13.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var12._M_pi;
  pVar13.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (ptr<resp_msg>)pVar13.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

ptr<resp_msg> raft_server::handle_install_snapshot_req(req_msg& req)
{
    if (req.get_term() == state_->get_term() && !catching_up_)
    {
        if (role_ == srv_role::candidate)
        {
            become_follower();
        }
        else if (role_ == srv_role::leader)
        {
            l_->err(lstrfmt("Receive InstallSnapshotRequest from another leader(%d) with same term, there must be a "
                            "bug, server exits")
                        .fmt(req.get_src()));
            ctx_->state_mgr_->system_exit(-1);
            ::exit(-1);
            return ptr<resp_msg>();
        }
        else
        {
            restart_election_timer();
        }
    }

    ptr<resp_msg> resp(cs_new<resp_msg>(state_->get_term(), msg_type::install_snapshot_response, id_, req.get_src()));
    if (!catching_up_ && req.get_term() < state_->get_term())
    {
        l_->info("received an install snapshot request which has lower term than this server, decline the request");
        return resp;
    }

    std::vector<ptr<log_entry>>& entries(req.log_entries());
    if (entries.size() != 1 || entries[0]->get_val_type() != log_val_type::snp_sync_req)
    {
        l_->warn("Receive an invalid InstallSnapshotRequest due to bad log entries or bad log entry value");
        return resp;
    }

    ptr<snapshot_sync_req> sync_req(snapshot_sync_req::deserialize(entries[0]->get_buf()));
    if (sync_req->get_snapshot().get_last_log_idx() <= sm_commit_index_)
    {
        l_->warn(sstrfmt("received a snapshot (%llu) that is older than current log store")
                     .fmt(sync_req->get_snapshot().get_last_log_idx()));
        return resp;
    }

    if (handle_snapshot_sync_req(*sync_req))
    {
        resp->accept(sync_req->get_offset() + sync_req->get_data().size());
    }

    return resp;
}